

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_lfdepx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  uint uVar1;
  TCGTemp *pTVar2;
  TCGv_i64 arg;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_1;
  uintptr_t o_5;
  uintptr_t o;
  TCGv_i64 ret;
  
  if (ctx->pr == true) {
    gen_exception_err(ctx,6,0x31);
    return;
  }
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x30
                     );
    ctx->access_type = 0x30;
  }
  pTVar2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00);
  pTVar2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar1 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(tcg_ctx_01,INDEX_op_mov_i64,(TCGArg)(ret + (long)tcg_ctx_01),
                          (TCGArg)(arg + (long)tcg_ctx_01));
      }
      goto LAB_00bab630;
    }
  }
  else {
    tcg_gen_op3_ppc64(tcg_ctx_01,INDEX_op_add_i64,(TCGArg)(ret + (long)tcg_ctx_01),
                      (TCGArg)((long)&tcg_ctx_01->pool_cur + (long)cpu_gpr[uVar1]),
                      (TCGArg)(arg + (long)tcg_ctx_01));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00bab630;
  }
  tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,arg);
LAB_00bab630:
  tcg_gen_qemu_ld_i64_ppc64
            (tcg_ctx_00,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00),ret,8,
             ctx->default_tcg_memop_mask | MO_64);
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)pTVar2,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64
            (tcg_ctx_00,(TCGTemp *)((TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00) + (long)tcg_ctx_00))
  ;
  return;
}

Assistant:

static void gen_lfdepx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    CHK_SV;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, PPC_TLB_EPID_LOAD, DEF_MEMOP(MO_Q));
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}